

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
disable_multiple_select
          (list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  auto_mutex M;
  
  M.r = (this->super_scrollable_region).super_drawable.m;
  M.m = (mutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  rmutex::lock(M.r,1);
  this->ms_enabled = false;
  auto_mutex::~auto_mutex(&M);
  return;
}

Assistant:

void list_box<S>::
    disable_multiple_select (
    )
    {
        auto_mutex M(m);
        ms_enabled = false;
    }